

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::
     handle_int_type_spec<fmt::v5::internal::int_type_checker<fmt::v5::internal::error_handler>>
               (char spec,int_type_checker<fmt::v5::internal::error_handler> *handler)

{
  int_type_checker<fmt::v5::internal::error_handler> *in_RSI;
  char in_DIL;
  
  if (in_DIL == '\0') {
LAB_00132f4c:
    int_type_checker<fmt::v5::internal::error_handler>::on_dec(in_RSI);
    return;
  }
  if (in_DIL == 'B') {
LAB_00132f64:
    int_type_checker<fmt::v5::internal::error_handler>::on_bin(in_RSI);
  }
  else {
    if (in_DIL != 'X') {
      if (in_DIL == 'b') goto LAB_00132f64;
      if (in_DIL == 'd') goto LAB_00132f4c;
      if (in_DIL == 'n') {
        int_type_checker<fmt::v5::internal::error_handler>::on_num(in_RSI);
        return;
      }
      if (in_DIL == 'o') {
        int_type_checker<fmt::v5::internal::error_handler>::on_oct(in_RSI);
        return;
      }
      if (in_DIL != 'x') {
        int_type_checker<fmt::v5::internal::error_handler>::on_error
                  ((int_type_checker<fmt::v5::internal::error_handler> *)0x132f92);
        return;
      }
    }
    int_type_checker<fmt::v5::internal::error_handler>::on_hex(in_RSI);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler &&handler) {
  switch (spec) {
  case 0: case 'd':
    handler.on_dec();
    break;
  case 'x': case 'X':
    handler.on_hex();
    break;
  case 'b': case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
    handler.on_num();
    break;
  default:
    handler.on_error();
  }
}